

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall
ON_MeshParameters::SetComputeCurvature(ON_MeshParameters *this,bool bComputeCurvature)

{
  undefined8 uVar1;
  ON_SubDDisplayParameters smp;
  ON_SubDDisplayParameters OStack_58;
  
  if (this->m_bComputeCurvature != bComputeCurvature) {
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar1;
    this->m_bComputeCurvature = bComputeCurvature;
  }
  SubDDisplayParameters(&OStack_58,this);
  ON_SubDDisplayParameters::SetComputeCurvature(&OStack_58,bComputeCurvature);
  SetSubDDisplayParameters(this,&OStack_58);
  return;
}

Assistant:

void ON_MeshParameters::SetComputeCurvature(
  bool bComputeCurvature
)
{
  Internal_SetBoolHelper(bComputeCurvature, &m_bComputeCurvature);
  ON_SubDDisplayParameters smp = this->SubDDisplayParameters();
  smp.SetComputeCurvature(bComputeCurvature);
  this->SetSubDDisplayParameters(smp);
}